

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_relation.cpp
# Opt level: O2

void __thiscall
duckdb::TableRelation::Update(TableRelation *this,string *update_list,string *condition)

{
  shared_ptr<duckdb::ClientContextWrapper,_true> *this_00;
  ParserOptions options;
  type context;
  ClientContext *this_01;
  pointer args_3;
  pointer pTVar1;
  pointer pTVar2;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> *this_02
  ;
  shared_ptr<duckdb::UpdateRelation,_true> update;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expressions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  update_columns;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  undefined8 local_78;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  local_68;
  ParserOptions local_48;
  
  local_68.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._16_8_ = 0;
  local_98._24_8_ = 0;
  local_78 = 0;
  this_00 = &(this->super_Relation).context;
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(this_00);
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_a8);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)local_a8);
  ParseCondition((duckdb *)local_98,context,condition);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(this_00);
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_a8);
  this_01 = shared_ptr<duckdb::ClientContext,_true>::operator->
                      ((shared_ptr<duckdb::ClientContext,_true> *)local_a8);
  ClientContext::GetParserOptions(&local_48,this_01);
  options.max_expression_depth = local_48.max_expression_depth;
  options.preserve_identifier_case = local_48.preserve_identifier_case;
  options.integer_division = local_48.integer_division;
  options._2_6_ = local_48._2_6_;
  options.extensions = local_48.extensions;
  Parser::ParseUpdateList
            (update_list,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&local_68,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)(local_98 + 0x10),options);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  this_02 = &this->description;
  args_3 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_02);
  pTVar1 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_02);
  pTVar2 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_02);
  make_shared_ptr<duckdb::UpdateRelation,duckdb::shared_ptr<duckdb::ClientContextWrapper,true>&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,duckdb::vector<std::__cxx11::string,true>,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)local_a8,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             &args_3->database,&pTVar1->schema,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&pTVar2->table,&local_68);
  shared_ptr<duckdb::UpdateRelation,_true>::operator->
            ((shared_ptr<duckdb::UpdateRelation,_true> *)local_a8);
  Relation::Execute((Relation *)(local_98 + 8));
  if ((long *)local_98._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_98._8_8_ + 8))();
  }
  local_98._8_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (**(code **)(*(long *)local_98._0_8_ + 8))();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)(local_98 + 0x10));
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  return;
}

Assistant:

void TableRelation::Update(const string &update_list, const string &condition) {
	vector<string> update_columns;
	vector<unique_ptr<ParsedExpression>> expressions;
	auto cond = ParseCondition(*context->GetContext(), condition);
	Parser::ParseUpdateList(update_list, update_columns, expressions, context->GetContext()->GetParserOptions());
	auto update =
	    make_shared_ptr<UpdateRelation>(context, std::move(cond), description->database, description->schema,
	                                    description->table, std::move(update_columns), std::move(expressions));
	update->Execute();
}